

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macros.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Disa::console_format_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Disa *this,Log_Level level,source_location *location)

{
  ulong uVar1;
  undefined8 *puVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  char *pcVar16;
  undefined8 uVar17;
  uint __val;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar2 = *(undefined8 **)CONCAT71(in_register_00000011,level);
  if (puVar2 == (undefined8 *)0x0) {
    pcVar16 = "";
  }
  else {
    pcVar16 = (char *)*puVar2;
  }
  sVar9 = strlen(pcVar16);
  if (sVar9 == 0) {
LAB_00112a7a:
    __pos = 0;
  }
  else {
    sVar10 = sVar9 + 1;
    do {
      if (sVar10 == 1) goto LAB_00112a7a;
      __pos = sVar10 - 1;
      lVar3 = sVar10 - 2;
      sVar10 = __pos;
    } while (pcVar16[lVar3] != '/');
  }
  if (puVar2 == (undefined8 *)0x0) {
    pcVar16 = "";
  }
  else {
    pcVar16 = (char *)*puVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar16,&local_d1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_70,&local_50,__pos,0xffffffffffffffff);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_70,"::");
  paVar14 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
  paVar12 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar12) {
    local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  lVar3 = *(long *)CONCAT71(in_register_00000011,level);
  uVar8 = 1;
  if (lVar3 == 0) {
    __val = 0;
  }
  else {
    __val = *(uint *)(lVar3 + 0x10);
    if (9 < __val) {
      uVar7 = 4;
      uVar15 = __val;
      do {
        uVar8 = uVar7;
        if (uVar15 < 100) {
          uVar8 = uVar8 - 2;
          goto LAB_00112b7a;
        }
        if (uVar15 < 1000) {
          uVar8 = uVar8 - 1;
          goto LAB_00112b7a;
        }
        if (uVar15 < 10000) goto LAB_00112b7a;
        bVar6 = 99999 < uVar15;
        uVar7 = uVar8 + 4;
        uVar15 = uVar15 / 10000;
      } while (bVar6);
      uVar8 = uVar8 + 1;
    }
  }
LAB_00112b7a:
  paVar12 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,(ulong)uVar8,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,__val);
  uVar1 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
          local_b0._M_string_length;
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar14) {
    uVar17 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < uVar1) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar12) {
      uVar17 = local_90.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar17) {
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_00112bfc;
    }
  }
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_b0,local_90._M_dataplus._M_p,
                      CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
LAB_00112bfc:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if (paVar4 == paVar13) {
    local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar4;
  }
  local_f8._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  paVar13->_M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_f8,"]: ");
  local_d0 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0 == paVar13) {
    local_c0 = paVar13->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = paVar13->_M_allocated_capacity;
  }
  local_c8 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  paVar13 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar13) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar12) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar14) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  switch((ulong)this & 0xff) {
  case 0:
    local_f8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_f8,0,0,"[Error|",7);
    break;
  case 1:
    local_f8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_f8,0,0,"[Warn |",7);
    break;
  case 2:
    local_f8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_f8,0,0,"[Info |",7);
    break;
  case 3:
    local_f8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d0,(pointer)(local_c8 + (long)local_d0));
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_f8,0,0,"[Debug|",7);
    break;
  default:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d0,(pointer)(local_c8 + (long)local_d0));
    std::operator+(&local_b0,"[Error|",&local_70);
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_b0," Unrecognised log level parsed.");
    local_f8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar14 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar14) {
      local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_f8._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_f8._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    exit(1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar14) {
    uVar17 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar17;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar13) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<char> console_format(const Log_Level level, const std::source_location& location) {
  auto const iter = std::basic_string_view<char>(location.file_name()).find_last_of('/');
  const auto suffix =
  std::basic_string<char>(location.file_name()).substr(iter + 1) + "::" + std::to_string(location.line()) + "]: ";
  switch(level) {
    case Log_Level::Debug:
      return "[Debug|" + std::basic_string(suffix);
    case Log_Level::Info:
      return "[Info |" + std::basic_string(suffix);
    case Log_Level::Warning:
      return "[Warn |" + std::basic_string(suffix);
    case Log_Level::Error:
      return "[Error|" + std::basic_string(suffix);
    default:
      std::cout << "[Error|" + std::basic_string(suffix) + " Unrecognised log level parsed.";
      exit(1);
  }
}